

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::MinimumSizeLabel::minimumSizeHint(MinimumSizeLabel *this)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  QSize QVar7;
  ulong uVar8;
  QArrayData *local_68;
  long local_58;
  QPicture local_50 [24];
  QPixmap local_38 [24];
  
  QLabel::text();
  if (local_58 == 0) {
    QLabel::pixmap();
    cVar2 = QPixmap::isNull();
    if (cVar2 != '\0') {
      lVar4 = QLabel::movie();
      if (lVar4 == 0) {
        QLabel::picture();
        cVar2 = QPicture::isNull();
        bVar1 = true;
        goto LAB_00164f44;
      }
    }
  }
  bVar1 = false;
  cVar2 = '\0';
LAB_00164f44:
  if (bVar1) {
    QPicture::~QPicture(local_50);
  }
  if (local_58 == 0) {
    QPixmap::~QPixmap(local_38);
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  if (cVar2 == '\0') {
    uVar5 = QLabel::sizeHint();
    uVar8 = uVar5 >> 0x20;
    uVar3 = FingerGeometry::width();
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 <= (int)uVar5) {
      uVar6 = uVar5 & 0xffffffff;
    }
    uVar3 = FingerGeometry::height();
    if ((int)(uVar5 >> 0x20) < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    QVar7 = (QSize)(uVar6 | uVar8 << 0x20);
  }
  else {
    QVar7.wd = 0;
    QVar7.ht = 0;
  }
  return QVar7;
}

Assistant:

QSize minimumSizeHint() const override
	{
		if( text().isEmpty() && pixmap( Qt::ReturnByValue ).isNull() && !movie() &&
			picture( Qt::ReturnByValue ).isNull() )
				return QSize( 0, 0 );
		else
		{
			const QSize labelSizeHint = QLabel::sizeHint();

			return QSize( qMax( labelSizeHint.width(), FingerGeometry::width() ),
				qMax( labelSizeHint.height(), FingerGeometry::height() ) );
		}
	}